

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

Vec_Int_t * Saig_ManCexAbstractionFlops(Aig_Man_t *p,Gia_ParAbs_t *pPars)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vFlops_00;
  Aig_Man_t *p_00;
  int *local_80;
  uint local_4c;
  int Iter;
  Vec_Int_t *vFlops;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAbs;
  Gia_ParAbs_t *pGStack_28;
  int nUseStart;
  Gia_ParAbs_t *pPars_local;
  Aig_Man_t *p_local;
  
  pAbs._4_4_ = 0;
  pGStack_28 = pPars;
  pPars_local = (Gia_ParAbs_t *)p;
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                  ,0x19f,"Vec_Int_t *Saig_ManCexAbstractionFlops(Aig_Man_t *, Gia_ParAbs_t *)");
  }
  if (pGStack_28->fVerbose != 0) {
    printf("Performing counter-example-based refinement.\n");
  }
  Aig_ManSetCioIds((Aig_Man_t *)pPars_local);
  vFlops_00 = Vec_IntStartNatural(1);
  pTemp = Saig_ManDupAbstraction((Aig_Man_t *)pPars_local,vFlops_00);
  if (pGStack_28->fVerbose == 0) {
    printf("Init : ");
    Aig_ManPrintStats(pTemp);
  }
  printf("Refining abstraction...\n");
  local_4c = 0;
  while( true ) {
    if (pGStack_28->fUseStart == 0) {
      local_80 = (int *)0x0;
    }
    else {
      local_80 = (int *)((long)&pAbs + 4);
    }
    p_00 = Saig_ManCexRefine((Aig_Man_t *)pPars_local,pTemp,vFlops_00,pGStack_28->nFramesBmc,
                             pGStack_28->nConfMaxBmc,pGStack_28->fUseBdds,pGStack_28->fUseDprove,
                             pGStack_28->fVerbose,local_80,&pGStack_28->Status,
                             &pGStack_28->nFramesDone);
    if (p_00 == (Aig_Man_t *)0x0) break;
    Aig_ManStop(pTemp);
    printf("ITER %4d : ",(ulong)local_4c);
    if (pGStack_28->fVerbose == 0) {
      Aig_ManPrintStats(p_00);
    }
    Ioa_WriteAiger(p_00,"gabs.aig",0,0);
    iVar2 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
    iVar3 = Aig_ManRegNum(p_00);
    iVar4 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
    if (((double)(iVar2 - iVar3) * 100.0) / (double)iVar4 < (double)pGStack_28->nRatio * 1.0) {
      printf("Refinements is stopped because flop reduction is less than %d%%\n",
             (ulong)(uint)pGStack_28->nRatio);
      Aig_ManStop(p_00);
      Vec_IntFree(vFlops_00);
      return (Vec_Int_t *)0x0;
    }
    local_4c = local_4c + 1;
    pTemp = p_00;
  }
  lVar1._0_4_ = pPars_local[5].nStableMax;
  lVar1._4_4_ = pPars_local[5].nRatio;
  if (lVar1 != 0) {
    free(*(void **)&pPars_local[5].nStableMax);
    pPars_local[5].nStableMax = 0;
    pPars_local[5].nRatio = 0;
  }
  *(Abc_Cex_t **)&pPars_local[5].nStableMax = pTemp->pSeqModel;
  pTemp->pSeqModel = (Abc_Cex_t *)0x0;
  Aig_ManStop(pTemp);
  return vFlops_00;
}

Assistant:

Vec_Int_t * Saig_ManCexAbstractionFlops( Aig_Man_t * p, Gia_ParAbs_t * pPars )
{
    int nUseStart = 0;
    Aig_Man_t * pAbs, * pTemp;
    Vec_Int_t * vFlops;
    int Iter;//, clk = Abc_Clock(), clk2 = Abc_Clock();//, iFlop;
    assert( Aig_ManRegNum(p) > 0 );
    if ( pPars->fVerbose )
        printf( "Performing counter-example-based refinement.\n" );
    Aig_ManSetCioIds( p );
    vFlops = Vec_IntStartNatural( 1 );
/*
    iFlop = Saig_ManFindFirstFlop( p );
    assert( iFlop >= 0 );
    vFlops = Vec_IntAlloc( 1 );
    Vec_IntPush( vFlops, iFlop );
*/
    // create the resulting AIG
    pAbs = Saig_ManDupAbstraction( p, vFlops );
    if ( !pPars->fVerbose )
    {
        printf( "Init : " );
        Aig_ManPrintStats( pAbs );
    }
    printf( "Refining abstraction...\n" );
    for ( Iter = 0; ; Iter++ )
    {
        pTemp = Saig_ManCexRefine( p, pAbs, vFlops, pPars->nFramesBmc, pPars->nConfMaxBmc, pPars->fUseBdds, pPars->fUseDprove, pPars->fVerbose, pPars->fUseStart?&nUseStart:NULL, &pPars->Status, &pPars->nFramesDone );
        if ( pTemp == NULL )
        {
            ABC_FREE( p->pSeqModel );
            p->pSeqModel = pAbs->pSeqModel;
            pAbs->pSeqModel = NULL;
            Aig_ManStop( pAbs );
            break;
        }
        Aig_ManStop( pAbs );
        pAbs = pTemp;
        printf( "ITER %4d : ", Iter );
        if ( !pPars->fVerbose )
            Aig_ManPrintStats( pAbs );
        // output the intermediate result of abstraction
        Ioa_WriteAiger( pAbs, "gabs.aig", 0, 0 );
//            printf( "Intermediate abstracted model was written into file \"%s\".\n", "gabs.aig" );
        // check if the ratio is reached
        if ( 100.0*(Aig_ManRegNum(p)-Aig_ManRegNum(pAbs))/Aig_ManRegNum(p) < 1.0*pPars->nRatio )
        {
            printf( "Refinements is stopped because flop reduction is less than %d%%\n", pPars->nRatio );
            Aig_ManStop( pAbs );
            pAbs = NULL;
            Vec_IntFree( vFlops );
            vFlops = NULL;
            break;
        }
    }
    return vFlops;
}